

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4m.cpp
# Opt level: O3

bool ReadD4M(MemFile *file,shared_ptr<Disk> *disk)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Disk *pDVar3;
  element_type *peVar4;
  bool bVar5;
  int iVar6;
  ssize_t sVar7;
  Data *data;
  size_t in_RCX;
  FILE *__stream;
  undefined1 auVar8 [16];
  uint8_t ab [256];
  Format local_164;
  short local_128 [2];
  char local_123;
  char cStack_122;
  char cStack_121;
  char cStack_120;
  char cStack_11f;
  char cStack_11e;
  char cStack_11d;
  char cStack_11c;
  char cStack_11b;
  char cStack_11a;
  char cStack_119;
  char cStack_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  
  iVar6 = MemFile::size(file);
  if ((iVar6 == 0x32a000) && (bVar5 = MemFile::seek(file,0x320800), bVar5)) {
    sVar7 = MemFile::read(file,(int)local_128,(void *)0x100,in_RCX);
    if ((char)sVar7 == '\0') {
      return false;
    }
    if (local_128[0] != 0x101) {
      return false;
    }
    auVar8[0] = -(local_123 == 'S');
    auVar8[1] = -(cStack_122 == 'Y');
    auVar8[2] = -(cStack_121 == 'S');
    auVar8[3] = -(cStack_120 == 'T');
    auVar8[4] = -(cStack_11f == 'E');
    auVar8[5] = -(cStack_11e == 'M');
    auVar8[6] = -(cStack_11d == -0x60);
    auVar8[7] = -(cStack_11c == -0x60);
    auVar8[8] = -(cStack_11b == -0x60);
    auVar8[9] = -(cStack_11a == -0x60);
    auVar8[10] = -(cStack_119 == -0x60);
    auVar8[0xb] = -(cStack_118 == -0x60);
    auVar8[0xc] = -(cStack_117 == -0x60);
    auVar8[0xd] = -(cStack_116 == -0x60);
    auVar8[0xe] = -(cStack_115 == -0x60);
    auVar8[0xf] = -(cStack_114 == -0x60);
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
        == 0xffff) {
      __stream = (FILE *)0x18;
      Format::Format(&local_164,D4M);
      MemFile::rewind(file,__stream);
      iVar6 = local_164.head1;
      local_164.head1 = local_164.head0;
      local_164.head0 = iVar6;
      pDVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      data = MemFile::data(file);
      Disk::format(pDVar3,&local_164,data,false);
      pDVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar1 = (pDVar3->fmt).head0;
      uVar2 = (pDVar3->fmt).head1;
      (pDVar3->fmt).head0 = uVar2;
      (pDVar3->fmt).head1 = uVar1;
      Disk::flip_sides(pDVar3);
      peVar4 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::_M_replace
                ((ulong)&peVar4->strType,0,(char *)(peVar4->strType)._M_string_length,0x1b0d9f);
      return true;
    }
  }
  return false;
}

Assistant:

bool ReadD4M(MemFile& file, std::shared_ptr<Disk>& disk)
{
    // D4M is a fixed-size image
    uint8_t ab[256];
    if (file.size() != D4M_DISK_SIZE || !file.seek(D4M_PARTITION_OFFSET) || !file.read(&ab, sizeof(ab)))
        return false;

    // Check a partition starts at track 1 sector 1, with "SYSTEM" name
    if (memcmp(ab, "\x01\x01", 2) || memcmp(ab + 5, "SYSTEM\xa0\xa0\xa0\xa0\xa0\xa0\xa0\xa0\xa0\xa0", 16))
        return false;

    Format fmt{ RegularFormat::D4M };

    // D2M stores the sides in the reverse order, so fiddle things to read it easily
    file.rewind();
    std::swap(fmt.head0, fmt.head1);
    disk->format(fmt, file.data());
    std::swap(disk->fmt.head0, disk->fmt.head1);
    disk->flip_sides();
    disk->strType = "D4M";

    return true;
}